

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)22>_> * __thiscall
vkt::texture::util::TextureRenderer::makeDescriptorSet
          (Move<vk::Handle<(vk::HandleType)22>_> *__return_storage_ptr__,TextureRenderer *this,
          VkDescriptorPool descriptorPool,VkDescriptorSetLayout setLayout)

{
  DeviceInterface *vk;
  undefined1 local_60 [8];
  VkDescriptorSetAllocateInfo allocateParams;
  VkDevice vkDevice;
  DeviceInterface *vkd;
  TextureRenderer *this_local;
  VkDescriptorSetLayout setLayout_local;
  VkDescriptorPool descriptorPool_local;
  
  this_local = (TextureRenderer *)setLayout.m_internal;
  setLayout_local.m_internal = descriptorPool.m_internal;
  vk = Context::getDeviceInterface(this->m_context);
  allocateParams.pSetLayouts = (VkDescriptorSetLayout *)Context::getDevice(this->m_context);
  local_60._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateParams._4_4_ = 0;
  allocateParams.pNext = (void *)setLayout_local.m_internal;
  allocateParams.descriptorPool.m_internal._0_4_ = 1;
  allocateParams._24_8_ = &this_local;
  ::vk::allocateDescriptorSet
            (__return_storage_ptr__,vk,(VkDevice)allocateParams.pSetLayouts,
             (VkDescriptorSetAllocateInfo *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Move<VkDescriptorSet> TextureRenderer::makeDescriptorSet (const VkDescriptorPool descriptorPool, const VkDescriptorSetLayout setLayout) const
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();

	const VkDescriptorSetAllocateInfo			allocateParams			=
	{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,		// VkStructureType					sType
			DE_NULL,											// const void*						pNext
			descriptorPool,										// VkDescriptorPool					descriptorPool
			1u,													// deUint32							descriptorSetCount
			&setLayout,											// const VkDescriptorSetLayout*		pSetLayouts
	};
	return allocateDescriptorSet(vkd, vkDevice, &allocateParams);
}